

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grant_message.cpp
# Opt level: O3

string * __thiscall
bidfx_public_api::price::pixie::GrantMessage::ToString_abi_cxx11_
          (string *__return_storage_ptr__,GrantMessage *this)

{
  ostream *poVar1;
  char *pcVar2;
  stringstream ss;
  stringstream local_1a0 [16];
  ostream local_190 [112];
  ios_base local_120 [264];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>(local_190,"Grant(granted=",0xe);
  pcVar2 = "false";
  if ((ulong)this->granted_ != 0) {
    pcVar2 = "true";
  }
  std::__ostream_insert<char,std::char_traits<char>>(local_190,pcVar2,(ulong)this->granted_ ^ 5);
  std::__ostream_insert<char,std::char_traits<char>>(local_190,", reason=",9);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (local_190,(this->reason_)._M_dataplus._M_p,(this->reason_)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,")",1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  std::ios_base::~ios_base(local_120);
  return __return_storage_ptr__;
}

Assistant:

const std::string GrantMessage::ToString()
{
    std::stringstream ss;

    ss << "Grant(granted=";

    if (granted_)
    {
        ss << "true";
    }
    else
    {
        ss << "false";
    }
    ss << ", reason=" << reason_ << ")";
    return ss.str();
}